

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressor.cpp
# Opt level: O0

void __thiscall
Imf_2_5::DwaCompressor::LossyDctDecoder::LossyDctDecoder
          (LossyDctDecoder *this,vector<char_*,_std::allocator<char_*>_> *rowPtrs,char *packedAc,
          char *packedDc,unsigned_short *toLinear,int width,int height,PixelType type)

{
  LossyDctDecoderBase *in_RCX;
  undefined8 *in_RDI;
  char *in_R8;
  undefined4 in_R9D;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  value_type *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  
  LossyDctDecoderBase::LossyDctDecoderBase
            (in_RCX,in_R8,(char *)CONCAT44(in_R9D,in_stack_ffffffffffffffd0),
             (unsigned_short *)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,
             in_stack_ffffffffffffffc0);
  *in_RDI = &PTR__LossyDctDecoder_00441550;
  std::
  vector<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
  ::push_back((vector<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
               *)CONCAT44(in_R9D,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8);
  std::vector<Imf_2_5::PixelType,_std::allocator<Imf_2_5::PixelType>_>::push_back
            ((vector<Imf_2_5::PixelType,_std::allocator<Imf_2_5::PixelType>_> *)
             CONCAT44(in_R9D,in_stack_ffffffffffffffd0),(value_type *)in_stack_ffffffffffffffc8);
  return;
}

Assistant:

LossyDctDecoder
        (std::vector<char *> &rowPtrs,
         char *packedAc,
         char *packedDc,
         const unsigned short *toLinear,
         int width,
         int height,
         PixelType type)
    :
        LossyDctDecoderBase(packedAc, packedDc, toLinear, width, height)
    {
        _rowPtrs.push_back(rowPtrs);
        _type.push_back(type);
    }